

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O3

int __thiscall
glcts::TextureCubeMapArraySamplingTest::programCollectionForFunction::init
          (programCollectionForFunction *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  TextureCubeMapArraySamplingTest *in_RCX;
  char *__to;
  char *__to_00;
  char *__to_01;
  char *__to_02;
  char *__to_03;
  char *__to_04;
  
  programDefinition::init(&this->program_with_sampling_compute_shader,ctx);
  programDefinition::init(&this->program_with_sampling_fragment_shader,ctx);
  programDefinition::init(&this->program_with_sampling_vertex_shader,ctx);
  link(in_RCX,(char *)this,__to);
  link(in_RCX,(char *)&this->program_with_sampling_fragment_shader,__to_00);
  iVar1 = link(in_RCX,(char *)&this->program_with_sampling_vertex_shader,__to_01);
  if ((in_RCX->super_TestCaseBase).m_is_geometry_shader_extension_supported == true) {
    programDefinition::init(&this->program_with_sampling_geometry_shader,ctx);
    iVar1 = link(in_RCX,(char *)&this->program_with_sampling_geometry_shader,__to_02);
  }
  if ((in_RCX->super_TestCaseBase).m_is_tessellation_shader_supported == true) {
    programDefinition::init(&this->program_with_sampling_tesselation_control_shader,ctx);
    programDefinition::init(&this->program_with_sampling_tesselation_evaluation_shader,ctx);
    link(in_RCX,(char *)&this->program_with_sampling_tesselation_control_shader,__to_03);
    iVar1 = link(in_RCX,(char *)&this->program_with_sampling_tesselation_evaluation_shader,__to_04);
    return iVar1;
  }
  return iVar1;
}

Assistant:

void TextureCubeMapArraySamplingTest::programCollectionForFunction::init(const glw::Functions&			  gl,
																		 const shaderGroup&				  shader_group,
																		 TextureCubeMapArraySamplingTest& test,
																		 bool							  isContextES)
{
	program_with_sampling_compute_shader.init(gl, shader_group, Compute, isContextES);
	program_with_sampling_fragment_shader.init(gl, shader_group, Fragment, isContextES);
	program_with_sampling_vertex_shader.init(gl, shader_group, Vertex, isContextES);

	test.link(program_with_sampling_compute_shader);
	test.link(program_with_sampling_fragment_shader);
	test.link(program_with_sampling_vertex_shader);

	if (test.m_is_geometry_shader_extension_supported)
	{
		program_with_sampling_geometry_shader.init(gl, shader_group, Geometry, isContextES);
		test.link(program_with_sampling_geometry_shader);
	}

	if (test.m_is_tessellation_shader_supported)
	{
		program_with_sampling_tesselation_control_shader.init(gl, shader_group, Tesselation_Control, isContextES);
		program_with_sampling_tesselation_evaluation_shader.init(gl, shader_group, Tesselation_Evaluation, isContextES);
		test.link(program_with_sampling_tesselation_control_shader);
		test.link(program_with_sampling_tesselation_evaluation_shader);
	}
}